

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O0

VARTYPE __thiscall Node::GetNodeVarType(Node *this)

{
  VARTYPE VVar1;
  VARTYPE VVar2;
  VariableStruct *pVVar3;
  VariableStruct *ThisVar;
  Node *this_local;
  
  switch(this->Type) {
  case 0x23:
  case 0x28:
  case 0x10f:
  case 0x1f0:
  case 0x1f1:
  case 0x1f2:
  case 499:
  case 500:
    if (this->Tree[0] != (Node *)0x0) {
      VVar1 = GetNodeVarType(this->Tree[0]);
      return VVar1;
    }
  default:
    goto switchD_0010f02c_caseD_24;
  case 0x2a:
  case 0x2b:
  case 0x2d:
  case 0x2f:
  case 0x5e:
    VVar1 = GetNodeVarType(this->Tree[0]);
    VVar2 = GetNodeVarType(this->Tree[1]);
    this_local._4_4_ = ChooseVarType(VVar1,VVar2);
    break;
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x131:
  case 0x157:
  case 0x1cf:
  case 0x1d0:
  case 0x1dd:
  case 0x1de:
  case 0x1df:
  case 0x1e0:
  case 0x1e1:
  case 0x1e2:
  case 0x1e3:
  case 0x1e4:
  case 0x1e5:
  case 0x1e6:
  case 0x1e7:
  case 0x1e8:
  case 0x1ea:
  case 0x1eb:
  case 0x1ec:
  case 0x1ed:
  case 0x1ee:
    this_local._4_4_ = VARTYPE_INTEGER;
    break;
  case 0x110:
    this_local._4_4_ = VARTYPE_BYTE;
    break;
  case 0x123:
    this_local._4_4_ = VARTYPE_DECIMAL;
    break;
  case 300:
    this_local._4_4_ = VARTYPE_DOUBLE;
    break;
  case 0x149:
    this_local._4_4_ = VARTYPE_GFLOAT;
    break;
  case 0x14f:
    this_local._4_4_ = VARTYPE_GFLOAT;
    break;
  case 0x15f:
    this_local._4_4_ = VARTYPE_LONG;
    break;
  case 0x182:
    this_local._4_4_ = VARTYPE_REAL;
    break;
  case 0x191:
  case 0x1d6:
  case 0x1ef:
  case 0x204:
  case 0x207:
  case 0x208:
    goto switchD_0010f02c_caseD_24;
  case 0x1a0:
    this_local._4_4_ = VARTYPE_DYNSTR;
    break;
  case 0x1ba:
    this_local._4_4_ = VARTYPE_WORD;
    break;
  case 0x1cd:
  case 0x1d3:
    pVVar3 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
    if (pVVar3 != (VariableStruct *)0x0) {
      return pVVar3->Type;
    }
    goto switchD_0010f02c_caseD_24;
  case 0x1ce:
    this_local._4_4_ = VARTYPE_REAL;
    break;
  case 0x1d4:
    this_local._4_4_ = VARTYPE_DYNSTR;
    break;
  case 0x1f5:
    if ((this->Tree[0] != (Node *)0x0) && (this->Tree[1] != (Node *)0x0)) {
      VVar1 = GetNodeVarType(this->Tree[0]);
      VVar2 = GetNodeVarType(this->Tree[1]);
      VVar1 = ChooseVarType(VVar1,VVar2);
      return VVar1;
    }
switchD_0010f02c_caseD_24:
    this_local._4_4_ = VARTYPE_NONE;
  }
  return this_local._4_4_;
}

Assistant:

VARTYPE Node::GetNodeVarType(void)
{
	VariableStruct *ThisVar;

	//
	// Handle this node type
	//
	switch (Type)
	{
	//
	// Takes the type of the rvalue
	//
	case '#':
	case '(':
	case BAS_N_ASSIGN:
	case BAS_N_ASSIGNLIST:
	case BAS_S_BY:
	case BAS_N_FORASSIGN:
	case BAS_N_UMINUS:
	case BAS_N_UPLUS:
		if (Tree[0] != 0)
		{
			return Tree[0]->GetNodeVarType();
		}
		break;

	//
	// Takes the 'higher' of the two types
	//
	case '+':
	case '-':
	case '*':
	case '/':
	case '^':
		return ChooseVarType(Tree[0]->GetNodeVarType(),
			Tree[1]->GetNodeVarType());

	case BAS_N_LIST:
		if ((Tree[0] != 0) && (Tree[1] != 0))
		{
			return ChooseVarType(Tree[0]->GetNodeVarType(),
				Tree[1]->GetNodeVarType());
		}
		break;
	//
	// Always an integer
	//
	case '=':
	case '>':
	case '<':
	case BAS_X_LAND:
	case BAS_S_AND:
	case BAS_S_EQV:
	case BAS_S_IMP:
	case BAS_S_ERL:
	case BAS_X_GE:
	case BAS_V_INT:
	case BAS_V_INTEGER:
	case BAS_X_LE:
	case BAS_X_NEQ:
	case BAS_S_NOT:
	case BAS_X_LNOT:
	case BAS_X_LOR:
	case BAS_S_OR:
	case BAS_X_UNARYGT:
	case BAS_X_UNARYGE:
	case BAS_X_UNARYLE:
	case BAS_X_UNARYLT:
	case BAS_X_UNARYNEQ:
	case BAS_S_XOR:
	case BAS_S_INTEGER:
		return VARTYPE_INTEGER;

	//
	// Always a floating point
	//
	case BAS_V_FLOAT:
		return VARTYPE_REAL;

	//
	// Always a string
	//
	case BAS_V_TEXTSTRING:
		return VARTYPE_DYNSTR;

	//
	// Function references
	//
	case BAS_V_FUNCTION:
	case BAS_V_NAME:
		//
		// Look for variable in table
		//
		ThisVar = Variables->Lookup(TextValue, Tree[0]);

		//
		// Print this variable
		//
		if (ThisVar != 0)
		{
			return ThisVar->Type;
		}
		break;

	case BAS_S_BYTE:
		return VARTYPE_BYTE;

	case BAS_S_DOUBLE:
		return VARTYPE_DOUBLE;

	case BAS_S_GFLOAT:
		return VARTYPE_GFLOAT;

	case BAS_S_HFLOAT:
		return VARTYPE_GFLOAT;

	case BAS_S_LONG:
		return VARTYPE_LONG;

	case BAS_S_WORD:
		return VARTYPE_WORD;

	case BAS_S_REAL:
		return VARTYPE_REAL;

	case BAS_S_STRING:
		return VARTYPE_DYNSTR;

	case BAS_S_DECIMAL:
		return VARTYPE_DECIMAL;

	//
	// Gonna havta handle these at some time, but for now ...
	//
	case BAS_V_PREDEF:
	case BAS_X_STRREF:
	case BAS_N_STRUCTNAME:
	case BAS_N_TYPEFUN:
	case BAS_N_VARTYPE:
	case BAS_S_RFA:

//**		return Type;

		break;
	}

	//
	// I don't know!
	//
	return VARTYPE_NONE;
}